

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

_Bool is_valid_tx_input(wally_tx_input *input)

{
  _Bool _Var1;
  
  if ((input == (wally_tx_input *)0x0) ||
     ((input->script != (uchar *)0x0) == (input->script_len == 0))) {
LAB_0010346f:
    _Var1 = false;
  }
  else {
    if (input->witness != (wally_tx_witness_stack *)0x0) {
      _Var1 = is_valid_witness_stack(input->witness);
      if (!_Var1) goto LAB_0010346f;
    }
    if (input->pegin_witness != (wally_tx_witness_stack *)0x0) {
      _Var1 = is_valid_witness_stack(input->pegin_witness);
      return _Var1;
    }
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool is_valid_tx_input(const struct wally_tx_input *input)
{
    return input &&
           BYTES_VALID(input->script, input->script_len) &&
           (!input->witness || is_valid_witness_stack(input->witness))
#ifdef BUILD_ELEMENTS
           && (!input->pegin_witness || is_valid_witness_stack(input->pegin_witness))
#endif
    ;
}